

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O3

void __thiscall agg::trans_double_path::reset(trans_double_path *this)

{
  (this->m_src_vertices1).super_pod_bvector<agg::vertex_dist,_6U>.m_size = 0;
  (this->m_src_vertices2).super_pod_bvector<agg::vertex_dist,_6U>.m_size = 0;
  this->m_kindex1 = 0.0;
  this->m_status1 = initial;
  this->m_status2 = initial;
  return;
}

Assistant:

void trans_double_path::reset()
    {
        m_src_vertices1.remove_all();
        m_src_vertices2.remove_all();
        m_kindex1 = 0.0;
        m_kindex1 = 0.0;
        m_status1 = initial;
        m_status2 = initial;
    }